

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::isParameterName(ErrorsTest *this,GLenum maybe_pname)

{
  GLenum GVar1;
  ulong uVar2;
  GLenum *pGVar3;
  ulong uVar4;
  
  pGVar3 = &DAT_0170fae0;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar4 == 4) break;
    GVar1 = *pGVar3;
    pGVar3 = pGVar3 + 1;
    uVar2 = uVar4 + 1;
  } while (GVar1 != maybe_pname);
  return uVar4 < 4;
}

Assistant:

bool ErrorsTest::isParameterName(glw::GLenum maybe_pname)
{
	glw::GLenum pnames[]	 = { GL_QUERY_RESULT, GL_QUERY_RESULT_AVAILABLE, GL_QUERY_RESULT_NO_WAIT, GL_QUERY_TARGET };
	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		if (maybe_pname == pnames[i])
		{
			return true;
		}
	}

	return false;
}